

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_Io * ZIP_duplicate(PHYSFS_Io *io)

{
  long *plVar1;
  int iVar2;
  PHYSFS_Io *__dest;
  long *__s;
  PHYSFS_Io *pPVar3;
  void *pvVar4;
  ZIPfileinfo *finfo;
  PHYSFS_Io *retval;
  ZIPfileinfo *origfinfo;
  PHYSFS_Io *io_local;
  
  plVar1 = (long *)io->opaque;
  __dest = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  __s = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(0xa8);
  if (__dest == (PHYSFS_Io *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else if (__s == (long *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    memset(__s,0,0xa8);
    *__s = *plVar1;
    pPVar3 = zip_get_io((PHYSFS_Io *)plVar1[1],(ZIPinfo *)0x0,(ZIPentry *)*__s);
    __s[1] = (long)pPVar3;
    if (__s[1] != 0) {
      initializeZStream((mz_stream *)(__s + 7));
      if (*(short *)(*__s + 0x46) == 0) {
LAB_00127ee9:
        memcpy(__dest,io,0x50);
        __dest->opaque = __s;
        return __dest;
      }
      pvVar4 = (*__PHYSFS_AllocatorHooks.Malloc)(0x4000);
      __s[3] = (long)pvVar4;
      if (__s[3] == 0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      }
      else {
        iVar2 = mz_inflateInit2((mz_streamp)(__s + 7),-0xf);
        iVar2 = zlib_err(iVar2);
        if (iVar2 == 0) goto LAB_00127ee9;
      }
    }
  }
  if (__s != (long *)0x0) {
    if (__s[1] != 0) {
      (**(code **)(__s[1] + 0x48))(__s[1]);
    }
    if (__s[3] != 0) {
      (*__PHYSFS_AllocatorHooks.Free)((void *)__s[3]);
      mz_inflateEnd((mz_streamp)(__s + 7));
    }
    (*__PHYSFS_AllocatorHooks.Free)(__s);
  }
  if (__dest != (PHYSFS_Io *)0x0) {
    (*__PHYSFS_AllocatorHooks.Free)(__dest);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *ZIP_duplicate(PHYSFS_Io *io)
{
    ZIPfileinfo *origfinfo = (ZIPfileinfo *) io->opaque;
    PHYSFS_Io *retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    ZIPfileinfo *finfo = (ZIPfileinfo *) allocator.Malloc(sizeof (ZIPfileinfo));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, failed);
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, failed);
    memset(finfo, '\0', sizeof (*finfo));

    finfo->entry = origfinfo->entry;
    finfo->io = zip_get_io(origfinfo->io, NULL, finfo->entry);
    GOTO_IF_ERRPASS(!finfo->io, failed);

    initializeZStream(&finfo->stream);
    if (finfo->entry->compression_method != COMPMETH_NONE)
    {
        finfo->buffer = (PHYSFS_uint8 *) allocator.Malloc(ZIP_READBUFSIZE);
        GOTO_IF(!finfo->buffer, PHYSFS_ERR_OUT_OF_MEMORY, failed);
        if (zlib_err(inflateInit2(&finfo->stream, -MAX_WBITS)) != Z_OK)
            goto failed;
    } /* if */

    memcpy(retval, io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;
    return retval;

failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);

        if (finfo->buffer != NULL)
        {
            allocator.Free(finfo->buffer);
            inflateEnd(&finfo->stream);
        } /* if */

        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}